

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int Strsafe_insert(char *data)

{
  s_x1node *psVar1;
  char **ppcVar2;
  int iVar3;
  s_x1 *psVar4;
  char cVar5;
  int iVar6;
  s_x1node *psVar7;
  char *pcVar8;
  s_x1node *psVar9;
  uint uVar10;
  s_x1node *psVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  s_x1node *__s;
  long lVar16;
  
  psVar4 = x1a;
  if (x1a == (s_x1 *)0x0) {
    return 0;
  }
  cVar5 = *data;
  if (cVar5 == '\0') {
    uVar15 = 0;
  }
  else {
    pcVar8 = data + 1;
    uVar15 = 0;
    do {
      uVar15 = (int)cVar5 + uVar15 * 0xd;
      cVar5 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar5 != '\0');
  }
  iVar3 = x1a->size;
  lVar16 = (long)iVar3;
  uVar14 = (long)(int)uVar15 & lVar16 - 1U;
  __s = (s_x1node *)x1a->ht;
  for (psVar7 = (s_x1node *)(&__s->data)[uVar14]; psVar7 != (s_x1node *)0x0; psVar7 = psVar7->next)
  {
    iVar6 = strcmp(psVar7->data,data);
    if (iVar6 == 0) {
      return 0;
    }
  }
  iVar6 = psVar4->count;
  if (iVar6 < iVar3) {
    psVar7 = psVar4->tbl;
  }
  else {
    psVar7 = (s_x1node *)malloc(lVar16 << 6);
    if (psVar7 == (s_x1node *)0x0) {
      return 0;
    }
    __s = psVar7 + lVar16 * 2;
    iVar13 = (int)(lVar16 * 2);
    if (0 < iVar3) {
      memset(__s,0,(lVar16 * 2 & 0xffffffffU) << 3);
    }
    if (iVar6 < 1) {
      psVar9 = psVar4->tbl;
    }
    else {
      psVar9 = psVar4->tbl;
      lVar16 = 0;
      do {
        pcVar8 = psVar9[lVar16].data;
        cVar5 = *pcVar8;
        uVar10 = 0;
        if (cVar5 != '\0') {
          uVar10 = 0;
          pcVar12 = pcVar8;
          do {
            pcVar12 = pcVar12 + 1;
            uVar10 = (int)cVar5 + uVar10 * 0xd;
            cVar5 = *pcVar12;
          } while (cVar5 != '\0');
        }
        psVar1 = psVar7 + lVar16;
        ppcVar2 = &__s->data + (int)(uVar10 & iVar13 - 1U);
        if ((s_x1node *)*ppcVar2 == (s_x1node *)0x0) {
          psVar11 = (s_x1node *)0x0;
        }
        else {
          ((s_x1node *)*ppcVar2)->from = &psVar1->next;
          psVar11 = (s_x1node *)*ppcVar2;
        }
        psVar1->next = psVar11;
        psVar1->data = pcVar8;
        psVar1->from = (s_x1node **)ppcVar2;
        *ppcVar2 = (char *)psVar1;
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar6);
    }
    free(psVar9);
    psVar4->size = iVar13;
    psVar4->tbl = psVar7;
    psVar4->ht = (s_x1node **)__s;
    uVar14 = (ulong)(int)(iVar13 - 1U & uVar15);
  }
  psVar4->count = iVar6 + 1;
  psVar7 = psVar7 + iVar6;
  psVar7->data = data;
  if ((s_x1node *)(&__s->data)[uVar14] == (s_x1node *)0x0) {
    psVar9 = (s_x1node *)0x0;
  }
  else {
    ((s_x1node *)(&__s->data)[uVar14])->from = &psVar7->next;
    psVar9 = (s_x1node *)(&__s->data)[uVar14];
  }
  psVar7->next = psVar9;
  (&__s->data)[uVar14] = (char *)psVar7;
  psVar7->from = psVar4->ht + uVar14;
  return 1;
}

Assistant:

int Strsafe_insert(const char *data)
{
  x1node *np;
  int h;
  int ph;

  if( x1a==0 ) return 0;
  ph = strhash(data);
  h = ph & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x1a->count>=x1a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x1 array;
    array.size = size = x1a->size*2;
    array.count = x1a->count;
    array.tbl = (x1node*)malloc(
      (sizeof(x1node) + sizeof(x1node*))*size );
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x1node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x1a->count; i++){
      x1node *oldnp, *newnp;
      oldnp = &(x1a->tbl[i]);
      h = strhash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x1a->tbl);
    *x1a = array;
  }
  /* Insert the new data */
  h = ph & (x1a->size-1);
  np = &(x1a->tbl[x1a->count++]);
  np->data = data;
  if( x1a->ht[h] ) x1a->ht[h]->from = &(np->next);
  np->next = x1a->ht[h];
  x1a->ht[h] = np;
  np->from = &(x1a->ht[h]);
  return 1;
}